

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O2

void __thiscall Js::Utf8SourceInfo::Dispose(Utf8SourceInfo *this,bool isShutdown)

{
  DebugDocument *pDVar1;
  
  pDVar1 = (this->m_debugDocument).ptr;
  if (pDVar1 != (DebugDocument *)0x0) {
    (**pDVar1->_vptr_DebugDocument)();
    (this->m_debugDocument).ptr = (DebugDocument *)0x0;
  }
  (this->debugModeSource).ptr = (uchar *)0x0;
  (this->sourceRef).ptr = (void *)0x0;
  return;
}

Assistant:

void
    Utf8SourceInfo::Dispose(bool isShutdown)
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        ClearDebugDocument();
        this->debugModeSource = nullptr;
#endif
#ifndef NTBUILD
        this->sourceRef = nullptr;
#endif
    }